

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O0

array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
* google::protobuf::compiler::cpp::MessageLayoutHelper::ConsolidateAlignedFieldGroups
            (array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             *__return_storage_ptr__,
            array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
            *field_groups,size_t alignment,size_t target_alignment)

{
  undefined8 uVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  ulong uVar4;
  reference this;
  reference this_00;
  size_type sVar5;
  iterator __first;
  iterator __last;
  reference other;
  ulong local_100;
  size_t j;
  FieldGroup field_group;
  size_t i;
  value_type *target_partition;
  value_type *partition;
  size_t h;
  size_t size_inflation;
  Voidify local_81;
  unsigned_long local_80;
  unsigned_long local_78;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_41;
  unsigned_long local_40;
  unsigned_long local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t target_alignment_local;
  size_t alignment_local;
  array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
  *field_groups_local;
  array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
  *partitions_aligned_to_target;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)target_alignment;
  target_alignment_local = alignment;
  alignment_local = (size_t)field_groups;
  field_groups_local = __return_storage_ptr__;
  local_38 = absl::lts_20250127::log_internal::GetReferenceableValue(target_alignment);
  local_40 = absl::lts_20250127::log_internal::GetReferenceableValue(target_alignment_local);
  local_30 = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_long,unsigned_long>
                       (&local_38,&local_40,"target_alignment > alignment");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message_layout_helper.cc"
               ,0x116,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_58);
  }
  local_78 = absl::lts_20250127::log_internal::GetReferenceableValue
                       ((ulong)absl_log_internal_check_op_result % target_alignment_local);
  local_80 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  local_70 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_78,&local_80,"target_alignment % alignment == size_t{0}");
  if (local_70 == (Nullable<const_char_*>)0x0) {
    uVar4 = (ulong)absl_log_internal_check_op_result / target_alignment_local;
    std::
    array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
    ::array(__return_storage_ptr__);
    for (partition = (value_type *)0x0; partition < (value_type *)0x6;
        partition = (value_type *)
                    ((long)&(partition->
                            super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1)) {
      this = std::
             array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             ::operator[]((array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                           *)alignment_local,(size_type)partition);
      this_00 = std::
                array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                ::operator[](__return_storage_ptr__,(size_type)partition);
      sVar5 = std::
              array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
              ::size((array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
                      *)alignment_local);
      std::
      vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
      ::reserve(this_00,((sVar5 - 1) + uVar4) / uVar4);
      __first = std::
                vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                ::begin(this);
      __last = std::
               vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
               ::end(this);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>>
                ((__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
                  )__first._M_current,
                 (__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
                  )__last._M_current);
      field_group.preferred_location_ = 0.0;
      field_group.estimated_memory_size_ = 0;
      for (; uVar1 = field_group._24_8_,
          sVar5 = std::
                  vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                  ::size(this), (ulong)uVar1 < sVar5;
          field_group._24_8_ = uVar4 + field_group._24_8_) {
        FieldGroup::FieldGroup((FieldGroup *)&j);
        local_100._0_4_ = field_group.preferred_location_;
        local_100._4_4_ = field_group.estimated_memory_size_;
        for (; sVar5 = std::
                       vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                       ::size(this), local_100 < sVar5 && local_100 < field_group._24_8_ + uVar4;
            local_100 = local_100 + 1) {
          other = std::
                  vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                  ::operator[](this,local_100);
          FieldGroup::Append((FieldGroup *)&j,other);
        }
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
        ::push_back(this_00,(value_type *)&j);
        FieldGroup::~FieldGroup((FieldGroup *)&j);
      }
    }
    return __return_storage_ptr__;
  }
  pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&size_inflation,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message_layout_helper.cc"
             ,0x117,pcVar2);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                     ((LogMessage *)&size_inflation);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&size_inflation);
}

Assistant:

std::array<std::vector<FieldGroup>, MessageLayoutHelper::kMaxHotness>
MessageLayoutHelper::ConsolidateAlignedFieldGroups(
    std::array<std::vector<FieldGroup>, kMaxHotness>& field_groups,
    size_t alignment, size_t target_alignment) {
  ABSL_CHECK_GT(target_alignment, alignment);
  ABSL_CHECK_EQ(target_alignment % alignment, size_t{0});

  const size_t size_inflation = target_alignment / alignment;
  std::array<std::vector<FieldGroup>, kMaxHotness> partitions_aligned_to_target;

  for (size_t h = 0; h < kMaxHotness; ++h) {
    auto& partition = field_groups[h];
    auto& target_partition = partitions_aligned_to_target[h];
    target_partition.reserve((field_groups.size() + size_inflation - 1) /
                             size_inflation);

    // Using stable_sort ensures that the output is consistent across runs.
    std::stable_sort(partition.begin(), partition.end());

    // Group fields into groups of `size_inflation` fields, which will be
    // aligned to `target_alignment`.
    for (size_t i = 0; i < partition.size(); i += size_inflation) {
      FieldGroup field_group;
      for (size_t j = i; j < partition.size() && j < i + size_inflation; ++j) {
        field_group.Append(partition[j]);
      }
      target_partition.push_back(field_group);
    }
  }

  return partitions_aligned_to_target;
}